

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuEcCreate(ec_o **pec,dstu_params *params,dstu_deep_i deep)

{
  long lVar1;
  bool_t bVar2;
  ulong uVar3;
  ulong n_00;
  size_t sVar4;
  size_t f_deep_00;
  qr_o *f_00;
  octet *A_00;
  octet *ybase;
  octet *xbase;
  ec_o *ec_00;
  undefined8 uVar5;
  octet *stack_00;
  octet *poVar6;
  ulong *puVar7;
  code *in_RDX;
  ushort *in_RSI;
  undefined8 *in_RDI;
  void *stack;
  ec_o *ec;
  octet *A;
  qr_o *f;
  size_t *p;
  void *state;
  size_t ec_deep;
  size_t ec_keep;
  size_t ec_d;
  size_t f_deep;
  size_t f_keep;
  size_t n;
  size_t m;
  size_t in_stack_ffffffffffffff48;
  octet c;
  octet *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff98;
  ulong *stack_01;
  size_t in_stack_ffffffffffffffa0;
  octet *B;
  ec_o *ec_01;
  err_t local_4;
  
  bVar2 = memIsValid(in_RSI,0x110);
  if ((((bVar2 == 0) || (uVar3 = (ulong)*in_RSI, uVar3 < 0xa0)) || (0x1fd < uVar3)) ||
     (1 < (byte)in_RSI[4])) {
    local_4 = 0x1f6;
  }
  else {
    n_00 = uVar3 + 0x3f >> 6;
    sVar4 = gf2Create_keep(in_stack_ffffffffffffff60);
    f_deep_00 = gf2Create_deep(in_stack_ffffffffffffffa0);
    ec_01 = (ec_o *)0x3;
    f_00 = (qr_o *)ec2CreateLD_keep(n_00);
    A_00 = (octet *)ec2CreateLD_deep(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ybase = (octet *)(f_deep_00 + 0x20);
    xbase = A_00 + (uVar3 + 7 >> 3);
    ec_00 = (ec_o *)ecCreateGroup_deep(f_deep_00);
    uVar5 = (*in_RDX)(n_00,f_deep_00,ec_01,A_00);
    utilMax(4,ybase,xbase,ec_00,uVar5);
    stack_00 = (octet *)blobCreate(in_stack_ffffffffffffff48);
    c = (octet)(in_stack_ffffffffffffff48 >> 0x38);
    if (stack_00 == (octet *)0x0) {
      local_4 = 0x6e;
    }
    else {
      poVar6 = stack_00 + (long)f_00;
      puVar7 = (ulong *)(poVar6 + sVar4);
      *puVar7 = (ulong)*in_RSI;
      puVar7[1] = (ulong)in_RSI[1];
      puVar7[2] = (ulong)in_RSI[2];
      puVar7[3] = (ulong)in_RSI[3];
      bVar2 = gf2Create((qr_o *)ec_01,(size_t *)f_00,A_00);
      if (bVar2 == 0) {
        blobClose((blob_t)0x1642c3);
        local_4 = 0x1f6;
      }
      else {
        *(char *)puVar7 = (char)in_RSI[4];
        stack_01 = puVar7;
        B = stack_00;
        memSet(in_stack_ffffffffffffff50,c,0x164316);
        lVar1 = *(long *)(poVar6 + 0x38);
        bVar2 = ec2CreateLD(ec_01,f_00,A_00,B,stack_01);
        if ((bVar2 != 0) &&
           (bVar2 = ecCreateGroup(ec_00,xbase,ybase,in_stack_ffffffffffffff50,
                                  (size_t)((long)puVar7 + lVar1),0,stack_00), bVar2 != 0)) {
          objAppend(xbase,ybase,(size_t)in_stack_ffffffffffffff50);
          *in_RDI = stack_00;
          return 0;
        }
        blobClose((blob_t)0x1643c8);
        local_4 = 0x1f6;
      }
    }
  }
  return local_4;
}

Assistant:

static err_t dstuEcCreate(
	ec_o** pec,						/* [out] описание эллиптической кривой */
	const dstu_params* params,		/* [in] долговременные параметры */
	dstu_deep_i deep				/* [in] потребности в стековой памяти */
)
{
	// размерности
	size_t m;
	size_t n;
	size_t f_keep;
	size_t f_deep;
	size_t ec_d;
	size_t ec_keep;
	size_t ec_deep;
	// состояние
	void* state;	
	size_t* p;			/* описание многочлена */
	qr_o* f;			/* поле */
	octet* A;			/* коэффициент A */
	ec_o* ec;			/* кривая */
	void* stack;
	// pre
	ASSERT(memIsValid(pec, sizeof(*pec)));
	// минимальная проверка входных данных
	if (!memIsValid(params, sizeof(dstu_params)) ||
		(m = params->p[0]) < 160 || m > 509 || 
		params->A > 1)
		return ERR_BAD_PARAMS;
	// определить размерности
	n = W_OF_B(m);
	f_keep = gf2Create_keep(m);
	f_deep = gf2Create_deep(m);
	ec_d = 3;
	ec_keep = ec2CreateLD_keep(n);
	ec_deep = ec2CreateLD_deep(n, f_deep);
	// создать состояние
	state = blobCreate(
		f_keep + ec_keep +
		utilMax(4,
			4 * sizeof(size_t) + f_deep,
			O_OF_B(m) + ec_deep,
			ecCreateGroup_deep(f_deep),
			deep(n, f_deep, ec_d, ec_deep)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// создать поле
	f = (qr_o*)((octet*)state + ec_keep);
	p = (size_t*)((octet*)f + f_keep);
	p[0] = params->p[0];
	p[1] = params->p[1];
	p[2] = params->p[2];
	p[3] = params->p[3];
	stack = p + 4;
	if (!gf2Create(f, p, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// создать кривую и группу
	ec = (ec_o*)state;
	A = (octet*)p;
	A[0] = params->A;
	memSetZero(A + 1, f->no - 1);
	stack = A + f->no;
	if (!ec2CreateLD(ec, f, A, params->B, stack) ||
		!ecCreateGroup(ec, params->P, params->P + ec->f->no, params->n, 
			ec->f->no, params->c, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	*pec = ec;
	return ERR_OK;
}